

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffpsvc(char *card,char *value,char *comm,int *status)

{
  char *__s;
  char cVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  char strbuf [21];
  char local_48 [20];
  undefined1 local_34;
  
  if (0 < *status) {
    return *status;
  }
  *value = '\0';
  if (comm != (char *)0x0) {
    *comm = '\0';
  }
  sVar4 = strlen(card);
  if (0x50 < sVar4) {
    strncpy(local_48,card,0x14);
    local_34 = 0;
    ffxmsg(5,"The card string starting with the chars below is too long:");
    ffxmsg(5,local_48);
    *status = 0xcf;
    return 0xcf;
  }
  cVar1 = *card;
  iVar11 = (int)sVar4;
  if ((cVar1 == 'H') && (iVar3 = strncmp(card,"HIERARCH ",9), iVar3 == 0)) {
    sVar5 = strcspn(card,"=");
    if (sVar5 == sVar4) {
      if ((8 < sVar4 && comm != (char *)0x0) && (strcpy(comm,card + 8), 8 < iVar11)) {
        uVar9 = iVar11 - 9;
        do {
          if (comm[uVar9] != ' ') break;
          comm[uVar9] = '\0';
          bVar2 = 0 < (int)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar2);
      }
      goto LAB_0013aecf;
    }
LAB_0013ac98:
    lVar10 = sVar5 + 1;
  }
  else {
    if ((((sVar4 < 9) || ((cVar1 == 'C' && (iVar3 = strncmp(card,"COMMENT ",8), iVar3 == 0)))) ||
        ((cVar1 == 'H' && (iVar3 = strncmp(card,"HISTORY ",8), iVar3 == 0)))) ||
       ((((cVar1 == 'E' && (iVar3 = strncmp(card,"END     ",8), iVar3 == 0)) ||
         ((cVar1 == 'C' && (iVar3 = strncmp(card,"CONTINUE",8), iVar3 == 0)))) ||
        ((cVar1 == ' ' && (iVar3 = strncmp(card,"        ",8), iVar3 == 0)))))) {
      if ((8 < sVar4 && comm != (char *)0x0) && (strcpy(comm,card + 8), 8 < iVar11)) {
        uVar9 = iVar11 - 9;
        do {
          if (comm[uVar9] != ' ') break;
          comm[uVar9] = '\0';
          bVar2 = 0 < (int)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar2);
      }
      goto LAB_0013aecf;
    }
    if ((card[8] != '=') || (iVar3 = strncmp(card + 8,"= ",2), iVar3 != 0)) {
      sVar5 = strcspn(card,"=");
      if (sVar5 == sVar4) {
        if ((comm != (char *)0x0) && (strcpy(comm,card + 8), 8 < iVar11)) {
          uVar9 = iVar11 - 9;
          do {
            if (comm[uVar9] != ' ') break;
            comm[uVar9] = '\0';
            bVar2 = 0 < (int)uVar9;
            uVar9 = uVar9 - 1;
          } while (bVar2);
        }
        goto LAB_0013aecf;
      }
      goto LAB_0013ac98;
    }
    lVar10 = 10;
  }
  sVar5 = strspn(card + lVar10," ");
  uVar6 = sVar5 + lVar10;
  if (uVar6 != sVar4) {
    cVar1 = card[uVar6];
    if (cVar1 == '\'') {
      *value = '\'';
      uVar7 = uVar6 + 1;
      uVar8 = uVar7;
      iVar11 = 1;
      iVar3 = 1;
      if (uVar7 < sVar4) {
        do {
          if (card[uVar8] == '\'') {
            cVar1 = card[uVar6 + 2];
            value[iVar3] = '\'';
            uVar7 = uVar8;
            iVar11 = iVar3;
            if (cVar1 != '\'') break;
            uVar8 = uVar6 + 2;
            iVar3 = iVar3 + 1;
          }
          if (iVar3 < 0x46) {
            value[iVar3] = card[uVar8];
          }
          iVar11 = iVar3 + 1;
          uVar7 = uVar8 + 1;
          uVar6 = uVar8;
          if ((sVar4 <= uVar7) || (bVar2 = 0x44 < iVar3, uVar8 = uVar7, iVar3 = iVar11, bVar2))
          break;
        } while( true );
      }
      if ((uVar7 == sVar4) || (0x45 < iVar11)) {
        iVar3 = 0x45;
        if (iVar11 < 0x45) {
          iVar3 = iVar11;
        }
        (value + iVar3)[0] = '\'';
        (value + iVar3)[1] = '\0';
        ffxmsg(5,"This keyword string value has no closing quote:");
        ffxmsg(5,card);
      }
      else {
        value[(long)iVar11 + 1] = '\0';
        uVar7 = uVar6 + 2;
      }
    }
    else {
      __s = card + uVar6;
      if (cVar1 == '(') {
        sVar4 = strcspn(__s,")");
        sVar5 = strlen(__s);
        if ((0x45 < sVar4) || (sVar4 == sVar5)) {
          ffxmsg(5,"This complex keyword value has no closing \')\' within range:");
          ffxmsg(5,card);
          *status = 0xcd;
          return 0xcd;
        }
        strncpy(value,__s,sVar4 + 1);
        value[sVar4 + 1] = '\0';
        uVar7 = sVar4 + uVar6 + 1;
      }
      else if (cVar1 == '/') {
        uVar7 = uVar6 + 1;
      }
      else {
        sVar5 = strcspn(__s," /");
        sVar4 = 0x46;
        if (sVar5 < 0x46) {
          sVar4 = sVar5;
        }
        strncpy(value,__s,sVar4);
        value[sVar4] = '\0';
        uVar7 = sVar4 + uVar6;
      }
    }
    if (comm != (char *)0x0) {
      sVar4 = strspn(card + uVar7," ");
      uVar7 = sVar4 + uVar7;
      if (uVar7 < 0x50) {
        uVar6 = uVar7;
        if (card[uVar7] == '/') {
          uVar6 = uVar7 + 1;
          if (card[uVar7 + 1] == ' ') {
            uVar6 = uVar7 + 2;
          }
        }
        strncpy(comm,card + uVar6,0x48);
        comm[0x48] = '\0';
        sVar4 = strlen(comm);
        if (0 < (int)(uint)sVar4) {
          lVar10 = (ulong)((uint)sVar4 & 0x7fffffff) + 1;
          do {
            if (comm[lVar10 + -2] != ' ') break;
            comm[lVar10 + -2] = '\0';
            lVar10 = lVar10 + -1;
          } while (1 < lVar10);
        }
      }
    }
  }
LAB_0013aecf:
  return *status;
}

Assistant:

int ffpsvc(char *card,    /* I - FITS header card (nominally 80 bytes long) */
           char *value,   /* O - value string parsed from the card */
           char *comm,    /* O - comment string parsed from the card */
           int *status)   /* IO - error status   */
/*
  ParSe the Value and Comment strings from the input header card string.
  If the card contains a quoted string value, the returned value string
  includes the enclosing quote characters.  If comm = NULL, don't return
  the comment string.
*/
{
    int jj;
    size_t ii, cardlen, nblank, valpos;
    char strbuf[21];

    if (*status > 0)
        return(*status);

    value[0] = '\0';
    if (comm)
        comm[0] = '\0';

    cardlen = strlen(card);
    if (cardlen >= FLEN_CARD)
    {
       strncpy(strbuf,card,20);
       strbuf[20]='\0';
       ffpmsg("The card string starting with the chars below is too long:");
       ffpmsg(strbuf); 
       return(*status = BAD_KEYCHAR);
    }

    /* support for ESO HIERARCH keywords; find the '=' */
    if (FSTRNCMP(card, "HIERARCH ", 9) == 0)
    {
      valpos = strcspn(card, "=");

      if (valpos == cardlen)   /* no value indicator ??? */
      {
        if (comm != NULL)
        {
          if (cardlen > 8)
          {
            strcpy(comm, &card[8]);

            jj=cardlen - 8;
            for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
            {
               if (comm[jj] == ' ')
                  comm[jj] = '\0';
               else
                  break;
            }
          }
        }
        return(*status);  /* no value indicator */
      }
      valpos++;  /* point to the position after the '=' */
    }
    else if (cardlen < 9  ||
        FSTRNCMP(card, "COMMENT ", 8) == 0 ||  /* keywords with no value */
        FSTRNCMP(card, "HISTORY ", 8) == 0 ||
        FSTRNCMP(card, "END     ", 8) == 0 ||
        FSTRNCMP(card, "CONTINUE", 8) == 0 ||
        FSTRNCMP(card, "        ", 8) == 0 )
    {
        /*  no value, so the comment extends from cols 9 - 80  */
        if (comm != NULL)
        {
          if (cardlen > 8)
          {
             strcpy(comm, &card[8]);

             jj=cardlen - 8;
             for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
             {
               if (comm[jj] == ' ')
                  comm[jj] = '\0';
               else
                  break;
             }
          }
        }
        return(*status);
    }
    else if (FSTRNCMP(&card[8], "= ", 2) == 0  )
    {
        /* normal keyword with '= ' in cols 9-10 */
        valpos = 10;  /* starting position of the value field */
    }
    else
    {
      valpos = strcspn(card, "=");

      if (valpos == cardlen)   /* no value indicator ??? */
      {
        if (comm != NULL)
        {
          if (cardlen > 8)
          {
            strcpy(comm, &card[8]);

            jj=cardlen - 8;
            for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
            {
               if (comm[jj] == ' ')
                  comm[jj] = '\0';
               else
                  break;
            }
          }
        }
        return(*status);  /* no value indicator */
      }
      valpos++;  /* point to the position after the '=' */
    }

    nblank = strspn(&card[valpos], " "); /* find number of leading blanks */

    if (nblank + valpos == cardlen)
    {
      /* the absence of a value string is legal, and simply indicates
         that the keyword value is undefined.  Don't write an error
         message in this case.
      */
        return(*status);
    }

    ii = valpos + nblank;

    if (card[ii] == '/' )  /* slash indicates start of the comment */
    {
         ii++;
    }
    else if (card[ii] == '\'' )  /* is this a quoted string value? */
    {
        value[0] = card[ii];
        for (jj=1, ii++; ii < cardlen && jj < FLEN_VALUE-1; ii++, jj++)
        {
            if (card[ii] == '\'')  /*  is this the closing quote?  */
            {
                if (card[ii+1] == '\'')  /* 2 successive quotes? */ 
                {
                   value[jj] = card[ii];
                   ii++;  
                   jj++;
                }
                else
                {
                    value[jj] = card[ii];
                    break;   /* found the closing quote, so exit this loop  */
                }
            }
            if (jj < FLEN_VALUE-1)
               value[jj] = card[ii];  /* copy the next character to the output */
        }

        if (ii == cardlen || jj >= FLEN_VALUE-1)
        {
            jj = minvalue(jj, FLEN_VALUE-2);  /* don't exceed 70 char string length */
            value[jj] = '\'';  /*  close the bad value string  */
            value[jj+1] = '\0';  /*  terminate the bad value string  */
            ffpmsg("This keyword string value has no closing quote:");
            ffpmsg(card);
	    /*  May 2008 - modified to not fail on this minor error  */
/*            return(*status = NO_QUOTE);  */
        }
        else
        {
            value[jj+1] = '\0';  /*  terminate the good value string  */
            ii++;   /*  point to the character following the value  */
        }
    }
    else if (card[ii] == '(' )  /* is this a complex value? */
    {
        nblank = strcspn(&card[ii], ")" ); /* find closing ) */
        if (nblank == strlen( &card[ii] ) || nblank >= FLEN_VALUE-1 )
        {
            ffpmsg("This complex keyword value has no closing ')' within range:");
            ffpmsg(card);
            return(*status = NO_QUOTE);
        }

        nblank++;
        strncpy(value, &card[ii], nblank);
        value[nblank] = '\0';
        ii = ii + nblank;        
    }
    else   /*  an integer, floating point, or logical FITS value string  */
    {
        nblank = strcspn(&card[ii], " /");  /* find the end of the token */
        if (nblank >= FLEN_VALUE) /* This should not happen for correct input */
           nblank = FLEN_VALUE-1;
        strncpy(value, &card[ii], nblank);
        value[nblank] = '\0';
        ii = ii + nblank;
    }

    /*  now find the comment string, if any  */
    if (comm)
    {
      nblank = strspn(&card[ii], " ");  /*  find next non-space character  */
      ii = ii + nblank;

      if (ii < 80)
      {
        if (card[ii] == '/')   /*  ignore the slash separator  */
        {
            ii++;
            if (card[ii] == ' ')  /*  also ignore the following space  */
                ii++;
        }
        strncpy(comm, &card[ii],FLEN_COMMENT-1);  /*  copy the remaining characters  */
        comm[FLEN_COMMENT-1] = '\0';

        jj=strlen(comm);
        for (jj--; jj >= 0; jj--)  /* replace trailing blanks with nulls */
        {
            if (comm[jj] == ' ')
                comm[jj] = '\0';
            else
                break;
        }
      }
    }
    return(*status);
}